

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uStack_50;
  char buffer [5];
  int fd;
  
  iVar1 = uv_fileno(handle,&fd);
  if (iVar1 != 0) {
    pcVar5 = "0 == uv_fileno((uv_handle_t*)handle, &fd)";
    uStack_50 = 0x49;
    goto LAB_0014a47f;
  }
  buffer[4] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  if ((events & 8U) != 0) {
    do {
      sVar3 = recv(client_fd,buffer,5,1);
      if ((int)sVar3 != -1) {
        if (-1 < (int)sVar3) goto LAB_0014a1ac;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        break;
      }
      piVar4 = __errno_location();
      iVar1 = *piVar4;
    } while (iVar1 == 4);
    if (iVar1 == 0x16) {
      pcVar5 = "n >= 0 || errno != EINVAL";
      uStack_50 = 0x50;
      goto LAB_0014a47f;
    }
LAB_0014a1ac:
    cli_pr_check = 1;
    iVar1 = uv_poll_stop(poll_req);
    if (iVar1 != 0) {
      pcVar5 = "0 == uv_poll_stop(&poll_req[0])";
      uStack_50 = 0x52;
      goto LAB_0014a47f;
    }
    iVar1 = uv_poll_start(poll_req,3,poll_cb);
    if (iVar1 != 0) {
      pcVar5 = "0 == uv_poll_start(&poll_req[0], UV_READABLE | UV_WRITABLE, poll_cb)";
      uStack_50 = 0x55;
      goto LAB_0014a47f;
    }
  }
  if ((events & 1U) != 0) {
    if (fd == client_fd) {
      do {
        sVar3 = recv(client_fd,buffer,5,0);
        iVar1 = (int)sVar3;
        if (iVar1 != -1) {
          if (-1 < iVar1) goto LAB_0014a249;
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          break;
        }
        piVar4 = __errno_location();
        iVar2 = *piVar4;
      } while (iVar2 == 4);
      if (iVar2 == 0x16) {
        pcVar5 = "n >= 0 || errno != EINVAL";
        uStack_50 = 0x5c;
        goto LAB_0014a47f;
      }
LAB_0014a249:
      if (cli_rd_check == 0) {
        if (iVar1 == 4) {
          if (buffer._0_4_ == 0x6c6c6568) {
            iVar1 = 1;
            do {
              while( true ) {
                cli_rd_check = iVar1;
                sVar3 = recv(server_fd,buffer,5,0);
                iVar1 = (int)sVar3;
                if (iVar1 != -1) break;
                piVar4 = __errno_location();
                iVar2 = *piVar4;
                iVar1 = cli_rd_check;
                if (iVar2 != 4) {
LAB_0014a338:
                  if ((iVar2 == 0xb) || (iVar2 == 0x73)) goto LAB_0014a346;
                  pcVar5 = "got_eagain()";
                  uStack_50 = 0x71;
                  goto LAB_0014a47f;
                }
              }
              if (iVar1 < 1) {
                piVar4 = __errno_location();
                iVar2 = *piVar4;
                goto LAB_0014a338;
              }
              if (iVar1 != 5) {
                pcVar5 = "n == 5";
                uStack_50 = 0x6b;
                goto LAB_0014a47f;
              }
              iVar2 = bcmp(buffer,"world",5);
              iVar1 = 2;
            } while (iVar2 == 0);
            pcVar5 = "strncmp(buffer, \"world\", n) == 0";
            uStack_50 = 0x6c;
          }
          else {
            pcVar5 = "strncmp(buffer, \"hello\", n) == 0";
            uStack_50 = 100;
          }
        }
        else {
          pcVar5 = "n == 4";
          uStack_50 = 99;
        }
        goto LAB_0014a47f;
      }
      if (cli_rd_check == 1) {
        iVar2 = strncmp(buffer,"world",(long)iVar1);
        if (iVar2 != 0) {
          pcVar5 = "strncmp(buffer, \"world\", n) == 0";
          uStack_50 = 0x5e;
          goto LAB_0014a47f;
        }
        if (iVar1 != 5) {
          pcVar5 = "5 == n";
          uStack_50 = 0x5f;
          goto LAB_0014a47f;
        }
        cli_rd_check = 2;
      }
    }
LAB_0014a346:
    if (fd == server_fd) {
      do {
        sVar3 = recv(server_fd,buffer,3,0);
        iVar1 = (int)sVar3;
        if (iVar1 != -1) {
          if (-1 < iVar1) {
            if (iVar1 != 3) goto LAB_0014a45d;
            iVar1 = bcmp(buffer,"foo",3);
            if (iVar1 == 0) {
              srv_rd_check = 1;
              uv_poll_stop(0x2f0510);
              goto LAB_0014a3f2;
            }
            pcVar5 = "strncmp(buffer, \"foo\", n) == 0";
            uStack_50 = 0x7a;
            goto LAB_0014a47f;
          }
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          break;
        }
        piVar4 = __errno_location();
        iVar1 = *piVar4;
      } while (iVar1 == 4);
      if (iVar1 == 0x16) {
        pcVar5 = "n >= 0 || errno != EINVAL";
        uStack_50 = 0x78;
      }
      else {
LAB_0014a45d:
        pcVar5 = "3 == n";
        uStack_50 = 0x79;
      }
      goto LAB_0014a47f;
    }
  }
LAB_0014a3f2:
  if ((events & 2U) == 0) {
    return;
  }
  do {
    sVar3 = send(client_fd,"foo",3,0);
    if (-1 < (int)sVar3) {
      if ((int)sVar3 == 3) {
        return;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  pcVar5 = "3 == n";
  uStack_50 = 0x83;
LAB_0014a47f:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
          ,uStack_50,pcVar5);
  abort();
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT(handle == &poll_handle);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));
  ASSERT_NOT_NULL(prev);
  ASSERT_NOT_NULL(curr);

  switch (poll_cb_called++) {
  case 0:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT(status == 0);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}